

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDVertex::MarkedEdgeCount(ON_SubDVertex *this)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = this->m_edge_count;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar5 = 0;
    uVar3 = 0;
    do {
      uVar4 = this->m_edges[uVar5].m_ptr & 0xfffffffffffffff8;
      if (uVar4 != 0) {
        bVar1 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(uVar4 + 0x10));
        uVar3 = uVar3 + bVar1;
        uVar2 = this->m_edge_count;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDVertex::MarkedEdgeCount() const
{
  unsigned int mark_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr != e && e->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}